

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_make_file(char *file,wchar_t line,char *path,wchar_t mode,wchar_t csize,
                           void *contents)

{
  int __fd;
  size_t sVar1;
  uint in_ECX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  int in_R8D;
  char *in_R9;
  ssize_t wsize;
  wchar_t fd;
  uint local_4c;
  size_t local_40;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  local_4c = in_ECX;
  if ((int)in_ECX < 0) {
    local_4c = 0x1a4;
  }
  __fd = open(in_RDX,0x41,(ulong)local_4c);
  if (__fd < 0) {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"Could not create %s",in_RDX);
    failure_finish((void *)0x11e209);
    local_4 = L'\0';
  }
  else {
    if (in_R9 != (char *)0x0) {
      if (in_R8D < 0) {
        local_40 = strlen(in_R9);
      }
      else {
        local_40 = (size_t)in_R8D;
      }
      sVar1 = write(__fd,in_R9,local_40);
      if (local_40 != sVar1) {
        close(__fd);
        failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"Could not write to %s",in_RDX);
        failure_finish((void *)0x11e29a);
        return L'\0';
      }
    }
    close(__fd);
    local_4 = L'\x01';
  }
  return local_4;
}

Assistant:

int
assertion_make_file(const char *file, int line,
    const char *path, int mode, int csize, const void *contents)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	/* TODO: Rework this to set file mode as well. */
	FILE *f;
	(void)mode; /* UNUSED */
	assertion_count(file, line);
	f = fopen(path, "wb");
	if (f == NULL) {
		failure_start(file, line, "Could not create file %s", path);
		failure_finish(NULL);
		return (0);
	}
	if (contents != NULL) {
		size_t wsize;

		if (csize < 0)
			wsize = strlen(contents);
		else
			wsize = (size_t)csize;
		if (wsize != fwrite(contents, 1, wsize, f)) {
			fclose(f);
			failure_start(file, line,
			    "Could not write file %s", path);
			failure_finish(NULL);
			return (0);
		}
	}
	fclose(f);
	return (1);
#else
	int fd;
	assertion_count(file, line);
	fd = open(path, O_CREAT | O_WRONLY, mode >= 0 ? mode : 0644);
	if (fd < 0) {
		failure_start(file, line, "Could not create %s", path);
		failure_finish(NULL);
		return (0);
	}
	if (contents != NULL) {
		ssize_t wsize;

		if (csize < 0)
			wsize = (ssize_t)strlen(contents);
		else
			wsize = (ssize_t)csize;
		if (wsize != write(fd, contents, wsize)) {
			close(fd);
			failure_start(file, line,
			    "Could not write to %s", path);
			failure_finish(NULL);
			return (0);
		}
	}
	close(fd);
	return (1);
#endif
}